

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O0

int lws_http_transaction_completed_client(lws *wsi)

{
  int iVar1;
  lws *plStack_18;
  int n;
  lws *wsi_local;
  
  plStack_18 = wsi;
  _lws_log(8,"%s: wsi: %p (%s)\n","lws_http_transaction_completed_client",wsi,wsi->protocol->name);
  iVar1 = user_callback_handle_rxflow
                    (plStack_18->protocol->callback,plStack_18,LWS_CALLBACK_COMPLETED_CLIENT_HTTP,
                     plStack_18->user_space,(void *)0x0,0);
  if (iVar1 == 0) {
    (plStack_18->http).rx_content_length = 0;
    iVar1 = _lws_generic_transaction_completed_active_conn(&stack0xffffffffffffffe8);
    if ((plStack_18->http).ah != (allocated_headers *)0x0) {
      if ((*(ulong *)&plStack_18->field_0x2dc >> 0x37 & 1) == 0) {
        if (iVar1 == 0) {
          _lws_header_table_reset((plStack_18->http).ah);
        }
      }
      else {
        __lws_header_table_detach(plStack_18,0);
      }
    }
    if ((iVar1 == 0) || ((plStack_18->http).ah == (allocated_headers *)0x0)) {
      wsi_local._4_4_ = 0;
    }
    else {
      lwsi_set_state(plStack_18,0x20b);
      ((plStack_18->http).ah)->parser_state = '`';
      ((plStack_18->http).ah)->lextable_pos = 0;
      ((plStack_18->http).ah)->unk_pos = 0;
      lws_set_timeout(plStack_18,PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,
                      plStack_18->context->timeout_secs);
      ((plStack_18->http).ah)->ues = '\0';
      lwsi_set_state(plStack_18,0x13);
      _lws_log(8,"%s: %p: new queued transaction\n","lws_http_transaction_completed_client",
               plStack_18);
      lws_callback_on_writable(plStack_18);
      wsi_local._4_4_ = 0;
    }
  }
  else {
    _lws_log(0x10,"%s: Completed call returned nonzero (role 0x%lx)\n",
             "lws_http_transaction_completed_client",(ulong)(plStack_18->wsistate & 0xffff0000));
    wsi_local._4_4_ = -1;
  }
  return wsi_local._4_4_;
}

Assistant:

int LWS_WARN_UNUSED_RESULT
lws_http_transaction_completed_client(struct lws *wsi)
{
	int n;

	lwsl_info("%s: wsi: %p (%s)\n", __func__, wsi, wsi->protocol->name);

	if (user_callback_handle_rxflow(wsi->protocol->callback, wsi,
					LWS_CALLBACK_COMPLETED_CLIENT_HTTP,
					wsi->user_space, NULL, 0)) {
		lwsl_debug("%s: Completed call returned nonzero (role 0x%lx)\n",
			   __func__, (unsigned long)lwsi_role(wsi));
		return -1;
	}

	wsi->http.rx_content_length = 0;

	/*
	 * For h1, wsi may pass some assets on to a queued child and be
	 * destroyed during this.
	 */
	n = _lws_generic_transaction_completed_active_conn(&wsi);

	if (wsi->http.ah) {
		if (wsi->client_mux_substream)
			/*
			 * As an h2 client, once we did our transaction, that is
			 * it for us.  Further transactions will happen as new
			 * SIDs on the connection.
			 */
			__lws_header_table_detach(wsi, 0);
		else
			if (!n)
				_lws_header_table_reset(wsi->http.ah);
	}

	if (!n || !wsi->http.ah)
		return 0;

	/*
	 * H1: we can serialize the queued guys into the same ah
	 * H2: everybody needs their own ah until their own STREAM_END
	 */

	/* otherwise set ourselves up ready to go again */
	lwsi_set_state(wsi, LRS_WAITING_SERVER_REPLY);

	wsi->http.ah->parser_state = WSI_TOKEN_NAME_PART;
	wsi->http.ah->lextable_pos = 0;
#if defined(LWS_WITH_CUSTOM_HEADERS)
	wsi->http.ah->unk_pos = 0;
#endif

	lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,
			wsi->context->timeout_secs);

	/* If we're (re)starting on headers, need other implied init */
	wsi->http.ah->ues = URIES_IDLE;
	lwsi_set_state(wsi, LRS_H1C_ISSUE_HANDSHAKE2);

	lwsl_info("%s: %p: new queued transaction\n", __func__, wsi);
	lws_callback_on_writable(wsi);

	return 0;
}